

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateArrayedI32Vec
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t num_components,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  ostringstream local_410 [8];
  ostringstream ss_1;
  undefined1 local_290 [4];
  uint32_t bit_width;
  string local_270;
  ostringstream local_250 [8];
  ostringstream ss;
  undefined1 local_d0 [4];
  uint32_t actual_num_components;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  uint32_t local_8c;
  undefined1 local_88 [4];
  uint32_t component_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Instruction *local_48;
  Instruction *type_inst;
  spv_result_t error;
  uint32_t underlying_type;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *diag_local;
  Instruction *pIStack_28;
  uint32_t num_components_local;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  type_inst._4_4_ = 0;
  _error = diag;
  diag_local._4_4_ = num_components;
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  type_inst._0_4_ = GetUnderlyingType(this->_,decoration,inst,(uint32_t *)((long)&type_inst + 4));
  this_local._4_4_ = (spv_result_t)type_inst;
  if ((spv_result_t)type_inst == SPV_SUCCESS) {
    local_48 = ValidationState_t::FindDef(this->_,type_inst._4_4_);
    OVar3 = Instruction::opcode(local_48);
    pfVar1 = _error;
    if (OVar3 == OpTypeArray) {
      local_8c = Instruction::word(local_48,2);
      bVar2 = ValidationState_t::IsIntVectorType(this->_,local_8c);
      pfVar1 = _error;
      if (bVar2) {
        uVar4 = ValidationState_t::GetDimension(this->_,local_8c);
        uVar5 = ValidationState_t::GetDimension(this->_,local_8c);
        if (uVar5 == diag_local._4_4_) {
          uVar4 = ValidationState_t::GetBitWidth(this->_,local_8c);
          if (uVar4 == 0x20) {
            this_local._4_4_ = SPV_SUCCESS;
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_410);
            (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                      (&local_430,this,(Decoration *)inst_local,pIStack_28);
            poVar6 = std::operator<<((ostream *)local_410,(string *)&local_430);
            poVar6 = std::operator<<(poVar6," has components with bit width ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar4);
            std::operator<<(poVar6,".");
            std::__cxx11::string::~string((string *)&local_430);
            pfVar1 = _error;
            std::__cxx11::ostringstream::str();
            this_local._4_4_ =
                 std::
                 function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 ::operator()(pfVar1,&local_450);
            std::__cxx11::string::~string((string *)&local_450);
            std::__cxx11::ostringstream::~ostringstream(local_410);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_250);
          (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                    (&local_270,this,(Decoration *)inst_local,pIStack_28);
          poVar6 = std::operator<<((ostream *)local_250,(string *)&local_270);
          poVar6 = std::operator<<(poVar6," has ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar4);
          std::operator<<(poVar6," components.");
          std::__cxx11::string::~string((string *)&local_270);
          pfVar1 = _error;
          std::__cxx11::ostringstream::str();
          this_local._4_4_ =
               std::
               function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               ::operator()(pfVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_290);
          std::__cxx11::string::~string((string *)local_290);
          std::__cxx11::ostringstream::~ostringstream(local_250);
        }
      }
      else {
        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                  ((string *)local_d0,this,(Decoration *)inst_local,pIStack_28);
        std::operator+(&local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ," is not an int vector.");
        this_local._4_4_ =
             std::
             function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::operator()(pfVar1,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)local_d0);
      }
    }
    else {
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                ((string *)local_88,this,(Decoration *)inst_local,pIStack_28);
      std::operator+(&local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     " is not an array.");
      this_local._4_4_ =
           std::
           function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(pfVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateArrayedI32Vec(
    const Decoration& decoration, const Instruction& inst,
    uint32_t num_components,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  const Instruction* const type_inst = _.FindDef(underlying_type);
  if (type_inst->opcode() != spv::Op::OpTypeArray) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an array.");
  }

  const uint32_t component_type = type_inst->word(2);
  if (!_.IsIntVectorType(component_type)) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an int vector.");
  }

  const uint32_t actual_num_components = _.GetDimension(component_type);
  if (_.GetDimension(component_type) != num_components) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst) << " has "
       << actual_num_components << " components.";
    return diag(ss.str());
  }

  const uint32_t bit_width = _.GetBitWidth(component_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  return SPV_SUCCESS;
}